

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  lua_State *L_00;
  char *pcVar2;
  lua_State *in_RSI;
  int in_EDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int i;
  lua_State *L;
  char *in_stack_00002000;
  lua_State *in_stack_00002008;
  char *in_stack_ffffffffffffffd8;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_4;
  
  L_00 = luaL_newstate();
  luaL_openlibs((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  luaL_register((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffd8,(luaL_Reg *)0x103421);
  if (in_EDI < 2) {
    local_4 = 8;
  }
  else {
    lua_createtable((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8);
    lua_pushstring(in_RSI,(char *)L_00);
    lua_rawseti(in_RSI,(int)((ulong)L_00 >> 0x20),(int)L_00);
    lua_setfield(L,i,(char *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    iVar1 = luaL_loadfile(in_stack_00002008,in_stack_00002000);
    if (iVar1 == 0) {
      for (in_stack_ffffffffffffffe4 = 2; in_stack_ffffffffffffffe4 < in_EDI;
          in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
        lua_pushstring(in_RSI,(char *)L_00);
      }
      iVar1 = lua_pcall(L,i,in_stack_00000008,unaff_retaddr_00);
      if (iVar1 == 0) {
        lua_close((lua_State *)0x103537);
        return 0;
      }
    }
    __stream = _stderr;
    pcVar2 = lua_tolstring(L_00,in_stack_ffffffffffffffe4,(size_t *)_stderr);
    fprintf(__stream,"Error: %s\n",pcVar2);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc,char**argv){
lua_State*L=luaL_newstate();
int i;
luaL_openlibs(L);
luaL_register(L,"bit",bitlib);
if(argc<2)return sizeof(void*);
lua_createtable(L,0,1);
lua_pushstring(L,argv[1]);
lua_rawseti(L,-2,0);
lua_setglobal(L,"arg");
if(luaL_loadfile(L,argv[1]))
goto err;
for(i=2;i<argc;i++)
lua_pushstring(L,argv[i]);
if(lua_pcall(L,argc-2,0,0)){
err:
fprintf(stderr,"Error: %s\n",lua_tostring(L,-1));
return 1;
}
lua_close(L);
return 0;
}